

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenerator::Run(cmQtAutoGenerator *this,string *infoFile,string *config)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  pointer pcVar4;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  undefined1 local_ac8 [16];
  __single_object makefile;
  cmStateDirectory local_a90;
  undefined1 local_a68 [8];
  cmStateSnapshot snapshot;
  cmGlobalGenerator gg;
  undefined1 local_430 [8];
  cmake cm;
  undefined1 local_a0 [7];
  bool success;
  string local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string msg;
  string *config_local;
  string *infoFile_local;
  cmQtAutoGenerator *this_local;
  
  msg.field_2._8_8_ = config;
  std::__cxx11::string::operator=((string *)&this->InfoFile_,(string *)infoFile);
  cmsys::SystemTools::ConvertToUnixSlashes(&this->InfoFile_);
  bVar1 = cmFileTime::Load(&this->InfoFileTime_,&this->InfoFile_);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)local_a0,infoFile);
    std::__cxx11::string::operator=((string *)&this->InfoDir_,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::operator=((string *)&this->InfoConfig_,(string *)msg.field_2._8_8_);
    cm._903_1_ = 0;
    cmake::cmake((cmake *)local_430,RoleScript,Unknown);
    psVar3 = InfoDir_abi_cxx11_(this);
    cmake::SetHomeOutputDirectory((cmake *)local_430,psVar3);
    psVar3 = InfoDir_abi_cxx11_(this);
    cmake::SetHomeDirectory((cmake *)local_430,psVar3);
    cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_430);
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
    cmGlobalGenerator::cmGlobalGenerator
              ((cmGlobalGenerator *)&snapshot.Position.Position,(cmake *)local_430);
    cmake::GetCurrentSnapshot((cmStateSnapshot *)local_a68,(cmake *)local_430);
    cmStateSnapshot::GetDirectory(&local_a90,(cmStateSnapshot *)local_a68);
    psVar3 = InfoDir_abi_cxx11_(this);
    cmStateDirectory::SetCurrentBinary(&local_a90,psVar3);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&makefile,(cmStateSnapshot *)local_a68);
    psVar3 = InfoDir_abi_cxx11_(this);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)&makefile,psVar3);
    local_ac8._0_8_ = &snapshot.Position.Position;
    std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
              ((cmGlobalGenerator **)(local_ac8 + 8),(cmStateSnapshot *)local_ac8);
    pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)(local_ac8 + 8))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"3.9",&local_ae9);
    std::__cxx11::string::string((string *)&local_b10);
    cmMakefile::SetPolicyVersion(pcVar4,&local_ae8,&local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::~string((string *)&local_ae8);
    std::allocator<char>::~allocator(&local_ae9);
    pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get
                       ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)(local_ac8 + 8))
    ;
    cmGlobalGenerator::SetCurrentMakefile((cmGlobalGenerator *)&snapshot.Position.Position,pcVar4);
    pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get
                       ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)(local_ac8 + 8))
    ;
    iVar2 = (*this->_vptr_cmQtAutoGenerator[2])(this,pcVar4);
    cm._903_1_ = (byte)iVar2 & 1;
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)(local_ac8 + 8));
    cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&snapshot.Position.Position);
    cmake::~cmake((cmake *)local_430);
    if ((cm._903_1_ & 1) != 0) {
      iVar2 = (*this->_vptr_cmQtAutoGenerator[3])();
      cm._903_1_ = (byte)iVar2 & 1;
    }
    this_local._7_1_ = (bool)(cm._903_1_ & 1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"AutoGen: The info file ",&local_49);
    std::allocator<char>::~allocator(&local_49);
    cmQtAutoGen::Quoted(&local_80,&this->InfoFile_);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::operator+=((string *)local_48," is not readable\n");
    cmSystemTools::Stderr((string *)local_48);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenerator::Run(std::string const& infoFile,
                            std::string const& config)
{
  // Info settings
  InfoFile_ = infoFile;
  cmSystemTools::ConvertToUnixSlashes(InfoFile_);
  if (!InfoFileTime_.Load(InfoFile_)) {
    std::string msg = "AutoGen: The info file ";
    msg += Quoted(InfoFile_);
    msg += " is not readable\n";
    cmSystemTools::Stderr(msg);
    return false;
  }
  InfoDir_ = cmSystemTools::GetFilenamePath(infoFile);
  InfoConfig_ = config;

  bool success = false;
  {
    cmake cm(cmake::RoleScript, cmState::Unknown);
    cm.SetHomeOutputDirectory(InfoDir());
    cm.SetHomeDirectory(InfoDir());
    cm.GetCurrentSnapshot().SetDefaultDefinitions();
    cmGlobalGenerator gg(&cm);

    cmStateSnapshot snapshot = cm.GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(InfoDir());
    snapshot.GetDirectory().SetCurrentSource(InfoDir());

    auto makefile = cm::make_unique<cmMakefile>(&gg, snapshot);
    // The OLD/WARN behavior for policy CMP0053 caused a speed regression.
    // https://gitlab.kitware.com/cmake/cmake/issues/17570
    makefile->SetPolicyVersion("3.9", std::string());
    gg.SetCurrentMakefile(makefile.get());
    success = this->Init(makefile.get());
  }
  if (success) {
    success = this->Process();
  }
  return success;
}